

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

size_t utf8spn(void *src,void *accept)

{
  char *pcVar1;
  size_t sVar2;
  void *pvVar3;
  char cVar4;
  ulong uVar5;
  bool bVar6;
  
  if (*src == '\0') {
LAB_00111606:
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    do {
      if (*accept == '\0') goto LAB_00111606;
      uVar5 = 0;
      pvVar3 = accept;
      cVar4 = *accept;
      while (uVar5 == 0) {
        bVar6 = cVar4 != *src;
        if (bVar6) {
          cVar4 = *(char *)((long)pvVar3 + 1);
        }
        else {
          cVar4 = *(char *)((long)pvVar3 + 1);
        }
        uVar5 = (ulong)!bVar6;
        pvVar3 = (void *)((long)pvVar3 + 1);
        if (cVar4 == '\0') {
          return sVar2;
        }
      }
      sVar2 = sVar2 + 1;
      pcVar1 = (char *)((long)src + uVar5);
      src = (void *)((long)src + uVar5);
    } while (*pcVar1 != '\0');
  }
  return sVar2;
}

Assistant:

size_t utf8spn(const void *src, const void *accept) {
  const char *s = (const char *)src;
  size_t chars = 0;

  while ('\0' != *s) {
    const char *a = (const char *)accept;
    size_t offset = 0;

    while ('\0' != *a) {
      // checking that if *r is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *a)) && (0 < offset)) {
        // found a match, so increment the number of utf8 codepoints
        // that have matched and stop checking whether any other utf8
        // codepoints in a match
        chars++;
        s += offset;
        break;
      } else {
        if (*a == s[offset]) {
          offset++;
          a++;
        } else {
          // a could be in the middle of an unmatching utf8 codepoint,
          // so we need to march it on to the next character beginning,
          do {
            a++;
          } while (0x80 == (0xc0 & *a));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // if a got to its terminating null byte, then we didn't find a match.
    // Return the current number of matched utf8 codepoints
    if ('\0' == *a) {
      return chars;
    }
  }

  return chars;
}